

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_sched_set_tensor_backend
               (ggml_backend_sched_t sched,ggml_tensor *node,ggml_backend_t backend)

{
  int iVar1;
  size_t sVar2;
  ggml_backend_t in_RDX;
  ggml_backend_sched_t in_RDI;
  int backend_index;
  undefined4 in_stack_ffffffffffffffd0;
  ggml_hash_set *hash_set;
  
  iVar1 = ggml_backend_sched_backend_id(in_RDI,in_RDX);
  if ((-1 < iVar1) && (iVar1 < in_RDI->n_backends)) {
    hash_set = (ggml_hash_set *)in_RDI->hv_tensor_backend_ids;
    sVar2 = ggml_hash_find_or_insert
                      (hash_set,(ggml_tensor *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    *(int *)((long)&hash_set->size + sVar2 * 4) = iVar1;
    in_RDI->is_reset = false;
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x65e,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends");
}

Assistant:

void ggml_backend_sched_set_tensor_backend(ggml_backend_sched_t sched, struct ggml_tensor * node, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);
    tensor_backend_id(node) = backend_index;
    SET_CAUSE(node, "usr");
    sched->is_reset = false;
}